

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.hpp
# Opt level: O0

void __thiscall
pstore::broker::
message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
::push(message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
       *this,unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             *message)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
  *message_local;
  message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
  *this_local;
  
  lock._8_8_ = message;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mut_);
  std::
  queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::deque<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>_>
  ::push(&this->queue_,(value_type *)lock._8_8_);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void message_queue<T>::push (T && message) {
            std::unique_lock<decltype (mut_)> lock (mut_);
            queue_.push (std::move (message));
            cv.notify_one ();
        }